

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

DdNode * Abc_NodeConeBdd(DdManager *dd,DdNode **pbVars,Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vVisited)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar5;
  int local_54;
  Abc_Obj_t *pAStack_50;
  int i;
  DdNode *bFunc;
  DdNode *bFunc1;
  DdNode *bFunc0;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  DdNode **pbVars_local;
  DdManager *dd_local;
  
  pAStack_50 = (Abc_Obj_t *)0x0;
  vLeaves_local = (Vec_Ptr_t *)pRoot;
  pRoot_local = (Abc_Obj_t *)pbVars;
  pbVars_local = (DdNode **)dd;
  Abc_NodeConeCollect((Abc_Obj_t **)&vLeaves_local,1,vLeaves,vVisited,0);
  for (local_54 = 0; iVar2 = Vec_PtrSize(vLeaves), local_54 < iVar2; local_54 = local_54 + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,local_54);
    *(Abc_Ntk_t **)((long)pvVar4 + 0x40) = (&pRoot_local->pNtk)[local_54];
  }
  for (local_54 = 0; iVar2 = Vec_PtrSize(vVisited), local_54 < iVar2; local_54 = local_54 + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vVisited,local_54);
    iVar2 = Abc_ObjIsPi(pObj);
    if (iVar2 != 0) {
      __assert_fail("!Abc_ObjIsPi(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                    ,0x204,
                    "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    pAVar5 = Abc_ObjFanin0(pObj);
    pvVar4 = (pAVar5->field_6).pTemp;
    iVar2 = Abc_ObjFaninC0(pObj);
    pAVar5 = Abc_ObjFanin1(pObj);
    pvVar1 = (pAVar5->field_6).pTemp;
    iVar3 = Abc_ObjFaninC1(pObj);
    pAStack_50 = (Abc_Obj_t *)
                 Cudd_bddAnd((DdManager *)pbVars_local,(DdNode *)((ulong)pvVar4 ^ (long)iVar2),
                             (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
    Cudd_Ref((DdNode *)pAStack_50);
    (pObj->field_6).pCopy = pAStack_50;
  }
  if (pAStack_50 == (Abc_Obj_t *)0x0) {
    __assert_fail("bFunc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReconv.c"
                  ,0x20a,
                  "DdNode *Abc_NodeConeBdd(DdManager *, DdNode **, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Cudd_Ref((DdNode *)pAStack_50);
  for (local_54 = 0; iVar2 = Vec_PtrSize(vVisited), local_54 < iVar2; local_54 = local_54 + 1) {
    pvVar4 = Vec_PtrEntry(vVisited,local_54);
    Cudd_RecursiveDeref((DdManager *)pbVars_local,*(DdNode **)((long)pvVar4 + 0x40));
  }
  Cudd_Deref((DdNode *)pAStack_50);
  return (DdNode *)pAStack_50;
}

Assistant:

DdNode * Abc_NodeConeBdd( DdManager * dd, DdNode ** pbVars, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    DdNode * bFunc0, * bFunc1, * bFunc = NULL;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVars[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    assert(bFunc);
    Cudd_Ref( bFunc );
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    Cudd_Deref( bFunc );
    return bFunc;
}